

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTDMT_CCtxPool * ZSTDMT_createCCtxPool(int nbWorkers,ZSTD_customMem cMem)

{
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  ZSTD_customMem customMem_01;
  int iVar1;
  pthread_mutex_t *__mutex;
  ZSTD_CCtx *pZVar2;
  int in_EDI;
  void *unaff_retaddr;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  ZSTDMT_CCtxPool *cctxPool;
  ZSTDMT_CCtxPool *pool;
  undefined4 in_stack_fffffffffffffff0;
  undefined8 in_stack_fffffffffffffff8;
  
  pool = (ZSTDMT_CCtxPool *)&stack0x00000008;
  customMem_01.customAlloc._4_4_ = in_EDI;
  customMem_01.customAlloc._0_4_ = in_stack_fffffffffffffff0;
  customMem_01.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffff8;
  customMem_01.opaque = unaff_retaddr;
  __mutex = (pthread_mutex_t *)ZSTD_customCalloc(in_stack_00000018,customMem_01);
  if (in_EDI < 1) {
    __assert_fail("nbWorkers > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x865c,"ZSTDMT_CCtxPool *ZSTDMT_createCCtxPool(int, ZSTD_customMem)");
  }
  if (__mutex == (pthread_mutex_t *)0x0) {
    __mutex = (pthread_mutex_t *)0x0;
  }
  else {
    iVar1 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
    if (iVar1 == 0) {
      *(long *)((long)__mutex + 0x30) = (pool->poolMutex).__align;
      *(undefined8 *)((long)__mutex + 0x38) = *(undefined8 *)((long)&pool->poolMutex + 8);
      *(undefined8 *)((long)__mutex + 0x40) = *(undefined8 *)((long)&pool->poolMutex + 0x10);
      __mutex[1].__data.__lock = in_EDI;
      *(undefined4 *)((long)__mutex + 0x2c) = 1;
      customMem.customFree = (ZSTD_freeFunction)in_stack_00000008;
      customMem.customAlloc = (ZSTD_allocFunction)unaff_retaddr;
      customMem.opaque = (void *)in_stack_00000010;
      pZVar2 = ZSTD_createCCtx_advanced(customMem);
      *(ZSTD_CCtx **)((long)__mutex + 0x48) = pZVar2;
      if (*(long *)((long)__mutex + 0x48) == 0) {
        ZSTDMT_freeCCtxPool(pool);
        __mutex = (pthread_mutex_t *)0x0;
      }
    }
    else {
      customMem_00.customFree = (ZSTD_freeFunction)__mutex;
      customMem_00.customAlloc = (ZSTD_allocFunction)pool;
      customMem_00.opaque._0_4_ = in_stack_fffffffffffffff0;
      customMem_00.opaque._4_4_ = in_EDI;
      ZSTD_customFree(*(void **)((long)&pool->poolMutex + 8),customMem_00);
      __mutex = (pthread_mutex_t *)0x0;
    }
  }
  return (ZSTDMT_CCtxPool *)__mutex;
}

Assistant:

static ZSTDMT_CCtxPool* ZSTDMT_createCCtxPool(int nbWorkers,
                                              ZSTD_customMem cMem)
{
    ZSTDMT_CCtxPool* const cctxPool = (ZSTDMT_CCtxPool*) ZSTD_customCalloc(
        sizeof(ZSTDMT_CCtxPool) + (nbWorkers-1)*sizeof(ZSTD_CCtx*), cMem);
    assert(nbWorkers > 0);
    if (!cctxPool) return NULL;
    if (ZSTD_pthread_mutex_init(&cctxPool->poolMutex, NULL)) {
        ZSTD_customFree(cctxPool, cMem);
        return NULL;
    }
    cctxPool->cMem = cMem;
    cctxPool->totalCCtx = nbWorkers;
    cctxPool->availCCtx = 1;   /* at least one cctx for single-thread mode */
    cctxPool->cctx[0] = ZSTD_createCCtx_advanced(cMem);
    if (!cctxPool->cctx[0]) { ZSTDMT_freeCCtxPool(cctxPool); return NULL; }
    DEBUGLOG(3, "cctxPool created, with %u workers", nbWorkers);
    return cctxPool;
}